

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall cmFileAPI::AddReplyIndexObject(cmFileAPI *this,Object *o)

{
  bool bVar1;
  mapped_type *this_00;
  Value *pVVar2;
  Object *o_00;
  string local_128;
  string local_108;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  this_00 = std::
            map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
            ::operator[](&this->ReplyIndexObjects,o);
  bVar1 = Json::Value::isNull(this_00);
  if (bVar1) {
    BuildObject(&local_e8,this,o);
    bVar1 = Json::Value::isObject(&local_e8);
    if (!bVar1) {
      __assert_fail("object.isObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileAPI.cxx"
                    ,0x182,"const Json::Value &cmFileAPI::AddReplyIndexObject(const Object &)");
    }
    Json::Value::Value(&local_48,objectValue);
    Json::Value::operator=(this_00,&local_48);
    Json::Value::~Value(&local_48);
    pVVar2 = Json::Value::operator[](&local_e8,"kind");
    Json::Value::Value(&local_70,pVVar2);
    pVVar2 = Json::Value::operator[](this_00,"kind");
    Json::Value::operator=(pVVar2,&local_70);
    Json::Value::~Value(&local_70);
    pVVar2 = Json::Value::operator[](&local_e8,"version");
    Json::Value::Value(&local_98,pVVar2);
    pVVar2 = Json::Value::operator[](this_00,"version");
    Json::Value::operator=(pVVar2,&local_98);
    Json::Value::~Value(&local_98);
    ObjectName_abi_cxx11_(&local_128,(cmFileAPI *)o,o_00);
    WriteJsonFile(&local_108,this,&local_e8,&local_128,ComputeSuffixHash);
    Json::Value::Value(&local_c0,&local_108);
    pVVar2 = Json::Value::operator[](this_00,"jsonFile");
    Json::Value::operator=(pVVar2,&local_c0);
    Json::Value::~Value(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value(&local_e8);
  }
  return this_00;
}

Assistant:

Json::Value const& cmFileAPI::AddReplyIndexObject(Object const& o)
{
  Json::Value& indexEntry = this->ReplyIndexObjects[o];
  if (!indexEntry.isNull()) {
    // The reply object has already been generated.
    return indexEntry;
  }

  // Generate this reply object.
  Json::Value const& object = this->BuildObject(o);
  assert(object.isObject());

  // Populate this index entry.
  indexEntry = Json::objectValue;
  indexEntry["kind"] = object["kind"];
  indexEntry["version"] = object["version"];
  indexEntry["jsonFile"] = this->WriteJsonFile(object, ObjectName(o));
  return indexEntry;
}